

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O1

void __thiscall FinalParser::ProcessDecl(FinalParser *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  pointer pqVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  Sym newsym;
  string local_130;
  string local_110;
  string local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char local_a0 [24];
  double dStack_88;
  Sym local_80;
  
  pqVar4 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
      super__Vector_impl_data._M_finish != pqVar4) {
    lVar7 = 0x20;
    lVar6 = 0;
    uVar5 = 0;
    do {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&(pqVar4->tokentype)._M_dataplus._M_p + lVar7));
      if (iVar2 == 0) {
        this->index = (int)uVar5;
        return;
      }
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&(((this->token).
                                           super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->tokentype).
                                         _M_dataplus + lVar7));
      if ((iVar2 == 0) ||
         (iVar2 = std::__cxx11::string::compare
                            ((char *)((long)&(((this->token).
                                               super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->tokentype
                                             )._M_dataplus + lVar7)), iVar2 == 0)) {
        pqVar4 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        lVar1 = *(long *)((long)&(pqVar4->tokentype)._M_dataplus + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,lVar1,
                   *(long *)((long)&(pqVar4->tokentype)._M_string_length + lVar7) + lVar1);
        pqVar4 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        lVar1 = *(long *)((long)&pqVar4[1].attributevalue._M_dataplus + lVar6);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,lVar1,
                   *(long *)((long)&pqVar4[1].attributevalue._M_string_length + lVar6) + lVar1);
        pqVar4 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        lVar1 = *(long *)((long)&pqVar4[3].attributevalue._M_dataplus + lVar6);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,lVar1,
                   *(long *)((long)&pqVar4[3].attributevalue._M_string_length + lVar6) + lVar1);
        Sym::Sym(&local_80,&local_110,&local_130,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        local_d0._0_8_ = local_d0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_80.Name._M_dataplus._M_p,
                   local_80.Name._M_dataplus._M_p + local_80.Name._M_string_length);
        local_b0._M_p = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_80.Type._M_dataplus._M_p,
                   local_80.Type._M_dataplus._M_p + local_80.Type._M_string_length);
        local_a0._16_8_ = local_80._64_8_;
        dStack_88 = local_80.dValue;
        SymTable::AddSym(&this->table,(Sym *)local_d0);
        if (local_b0._M_p != local_a0) {
          operator_delete(local_b0._M_p);
        }
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.Type._M_dataplus._M_p != &local_80.Type.field_2) {
          operator_delete(local_80.Type._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.Name._M_dataplus._M_p != &local_80.Name.field_2) {
          operator_delete(local_80.Name._M_dataplus._M_p);
        }
      }
      uVar5 = uVar5 + 1;
      pqVar4 = (this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->token).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pqVar4 >> 3) * -0x71c71c71c71c71c7;
      lVar7 = lVar7 + 0x48;
      lVar6 = lVar6 + 0x48;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  return;
}

Assistant:

void FinalParser::ProcessDecl() {

    for (int i = 0; i < token.size(); i++) {
        if (token[i].attributevalue == "{") {
            index = i;
            return;
        } else if (token[i].attributevalue == "real" || token[i].attributevalue == "int") {
            Sym newsym(token[i].attributevalue, token[i + 1].attributevalue, token[i + 3].attributevalue);
            table.AddSym(newsym);
        }
    }
}